

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppGenerator.cpp
# Opt level: O0

bool __thiscall CppGenerator::resortRelation(CppGenerator *this,size_t *rel_id,size_t *view_id)

{
  bool bVar1;
  long *in_RDX;
  long *in_RSI;
  bitset<100UL> *in_RDI;
  size_t *var;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  size_t orderIdx;
  TDNode *rel;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  reference local_60;
  reference local_50;
  unsigned_long *local_48;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  long local_38;
  long local_30;
  TDNode *local_28;
  long *local_20;
  long *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2e34d6);
  local_28 = TreeDecomposition::getRelation
                       ((TreeDecomposition *)
                        CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                        (size_t)in_stack_ffffffffffffff88);
  local_30 = 0;
  local_38 = in_RDI[8].super__Base_bitset<2UL>._M_w[1] + *local_20 * 0x18;
  local_40._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff88);
  local_48 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       (in_stack_ffffffffffffff88);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      return false;
    }
    local_50 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(&local_40);
    std::bitset<100UL>::operator[]
              (in_RDI,CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    in_stack_ffffffffffffff97 =
         std::bitset::reference::operator_cast_to_bool
                   ((reference *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    std::bitset<100UL>::reference::~reference(&local_60);
    if ((in_stack_ffffffffffffff97 & 1) != 0) {
      if (*(unsigned_long *)
           (*(long *)(in_RDI[0x10].super__Base_bitset<2UL>._M_w[1] + *local_18 * 8) + local_30 * 8)
          != *local_50) {
        return true;
      }
      local_30 = local_30 + 1;
    }
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_40);
  } while( true );
}

Assistant:

bool CppGenerator::resortRelation(const size_t& rel_id, const size_t& view_id)
{
    TDNode* rel = _td->getRelation(rel_id);
    
    size_t orderIdx = 0;
    for (const size_t& var : variableOrder[view_id])
    {
        if (rel->_bag[var])
        {
            if (sortOrders[rel_id][orderIdx] != var)
                return true;
            ++orderIdx;
        }
    }
    
    return false;
}